

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_executor.cpp
# Opt level: O2

SourceResultType __thiscall
duckdb::PipelineExecutor::GetData
          (PipelineExecutor *this,DataChunk *chunk,OperatorSourceInput *input)

{
  int iVar1;
  PhysicalOperator *pPVar2;
  
  pPVar2 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(&this->pipeline->source);
  iVar1 = (*pPVar2->_vptr_PhysicalOperator[0x11])
                    (pPVar2,&this->context,chunk,input,pPVar2->_vptr_PhysicalOperator[0x11]);
  return (SourceResultType)iVar1;
}

Assistant:

SourceResultType PipelineExecutor::GetData(DataChunk &chunk, OperatorSourceInput &input) {
	//! Testing feature to enable async source on every operator
#ifdef DUCKDB_DEBUG_ASYNC_SINK_SOURCE
	if (debug_blocked_source_count < debug_blocked_target_count) {
		debug_blocked_source_count++;

		auto &callback_state = input.interrupt_state;
		std::thread rewake_thread([callback_state] {
			std::this_thread::sleep_for(std::chrono::milliseconds(1));
			callback_state.Callback();
		});
		rewake_thread.detach();

		return SourceResultType::BLOCKED;
	}
#endif

	return pipeline.source->GetData(context, chunk, input);
}